

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O3

void * rw::hanimOpen(void *object,int32 offset,int32 size)

{
  AnimInterpolatorInfo *interpInfo;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/hanim.cpp line: 376"
  ;
  interpInfo = (AnimInterpolatorInfo *)(*DAT_0014ada8)(0x50,0x4011e);
  interpInfo->id = 1;
  interpInfo->interpKeyFrameSize = 0x30;
  interpInfo->animKeyFrameSize = 0x28;
  interpInfo->customDataSize = 0;
  interpInfo->applyCB = hanimApplyCB;
  interpInfo->blendCB = (BlendCB)0x0;
  interpInfo->interpCB = hanimInterpCB;
  interpInfo->addCB = (AddCB)0x0;
  interpInfo->mulRecipCB = (MulRecipCB)0x0;
  interpInfo->streamRead = hAnimFrameRead;
  interpInfo->streamWrite = hAnimFrameWrite;
  interpInfo->streamGetSize = hAnimFrameGetSize;
  AnimInterpolatorInfo::registerInterp(interpInfo);
  return object;
}

Assistant:

static void*
hanimOpen(void *object, int32 offset, int32 size)
{
	AnimInterpolatorInfo *info = rwNewT(AnimInterpolatorInfo, 1, MEMDUR_GLOBAL | ID_HANIM);
	info->id = 1;
	info->interpKeyFrameSize = sizeof(HAnimInterpFrame);
	info->animKeyFrameSize = sizeof(HAnimKeyFrame);
	info->customDataSize = 0;
	info->applyCB = hanimApplyCB;
	info->blendCB = nil;
	info->interpCB = hanimInterpCB;
	info->addCB = nil;
	info->mulRecipCB = nil;
	info->streamRead = hAnimFrameRead;
	info->streamWrite = hAnimFrameWrite;
	info->streamGetSize = hAnimFrameGetSize;
	AnimInterpolatorInfo::registerInterp(info);
	return object;
}